

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

uint64_t buffer_bookmark_pop(buffer_t *buffer,int width,int height,int *error)

{
  int iVar1;
  uint64_t offset;
  uintptr_t address;
  int *error_local;
  int height_local;
  int width_local;
  buffer_t *buffer_local;
  
  if (buffer->bookmarks_head < 0) {
    *error = 1;
    buffer_local = (buffer_t *)0x0;
  }
  else {
    iVar1 = buffer->bookmarks_head;
    buffer->bookmarks_head = iVar1 + -1;
    offset = buffer->bookmarks[iVar1];
    *error = 0;
    buffer_local = (buffer_t *)buffer_scroll(buffer,offset,width,height);
  }
  return (uint64_t)buffer_local;
}

Assistant:

uint64_t
buffer_bookmark_pop(buffer_t *buffer, int width, int height, int *error)
{
    if (buffer->bookmarks_head >= 0) {
        uintptr_t address = buffer->bookmarks[buffer->bookmarks_head--];
        *error = 0;
        return buffer_scroll(buffer, address, width, height);
    }

    *error = 1;
    return 0;
}